

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleContentModel.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SimpleContentModel::checkUniqueParticleAttribution
          (SimpleContentModel *this,SchemaGrammar *pGrammar,GrammarResolver *pGrammarResolver,
          XMLStringPool *pStringPool,XMLValidator *pValidator,uint *pContentSpecOrgURI,
          XMLCh *pComplexTypeName)

{
  uint uVar1;
  QName *q1;
  QName *q2;
  bool bVar2;
  XMLCh *text2;
  XMLCh *text3;
  SubstitutionGroupComparator local_38;
  
  q1 = this->fFirstChild;
  uVar1 = q1->fURIId;
  if (uVar1 != 0xffffffff && (uVar1 != 0xfffffffe && uVar1 != 0xfffffff1)) {
    q1->fURIId = pContentSpecOrgURI[uVar1];
  }
  q2 = this->fSecondChild;
  uVar1 = q2->fURIId;
  if (uVar1 != 0xffffffff && (uVar1 != 0xfffffffe && uVar1 != 0xfffffff1)) {
    q2->fURIId = pContentSpecOrgURI[uVar1];
  }
  if ((this->fOp & (Any_NS|Any_Other)) == Choice) {
    local_38.fGrammarResolver = pGrammarResolver;
    local_38.fStringPool = pStringPool;
    bVar2 = XercesElementWildcard::conflict(pGrammar,Leaf,q1,Leaf,q2,&local_38);
    if (bVar2) {
      text2 = QName::getRawName(this->fFirstChild);
      text3 = QName::getRawName(this->fSecondChild);
      XMLValidator::emitError
                (pValidator,UniqueParticleAttributionFail,pComplexTypeName,text2,text3,(XMLCh *)0x0)
      ;
    }
  }
  return;
}

Assistant:

void SimpleContentModel::checkUniqueParticleAttribution
    (
        SchemaGrammar*    const pGrammar
      , GrammarResolver*  const pGrammarResolver
      , XMLStringPool*    const pStringPool
      , XMLValidator*     const pValidator
      , unsigned int*     const pContentSpecOrgURI
      , const XMLCh*            pComplexTypeName /*= 0*/
    )
{
    // rename back
    unsigned int orgURIIndex = 0;

    orgURIIndex = fFirstChild->getURI();
    if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
        (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
        (orgURIIndex != XMLElementDecl::fgPCDataElemId))
        fFirstChild->setURI(pContentSpecOrgURI[orgURIIndex]);

    orgURIIndex = fSecondChild->getURI();
    if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
        (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
        (orgURIIndex != XMLElementDecl::fgPCDataElemId))
        fSecondChild->setURI(pContentSpecOrgURI[orgURIIndex]);

    // only possible violation is when it's a choice
    if ((fOp & 0x0f) == ContentSpecNode::Choice) {

        SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

        if (XercesElementWildcard::conflict(pGrammar,
                                            ContentSpecNode::Leaf,
                                            fFirstChild,
                                            ContentSpecNode::Leaf,
                                            fSecondChild,
                                            &comparator))

            pValidator->emitError(XMLValid::UniqueParticleAttributionFail,
                                  pComplexTypeName,
                                  fFirstChild->getRawName(),
                                  fSecondChild->getRawName());
    }
}